

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

void lua_concat(lua_State *L,int n)

{
  undefined8 uVar1;
  int *piVar2;
  uint64_t uVar3;
  int iVar4;
  TValue *pTVar5;
  int in_ESI;
  TValue *in_RDI;
  TValue *top;
  TValue in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  lua_State *in_stack_ffffffffffffffa0;
  
  if (in_ESI < 2) {
    if (in_ESI == 0) {
      piVar2 = (int *)in_RDI[3].u64;
      *piVar2 = in_RDI[1].u32.lo + 0xf8;
      piVar2[1] = -5;
      uVar3 = in_RDI[3].u64;
      in_RDI[3].u64 = uVar3 + 8;
      if ((ulong)in_RDI[4].u32.lo <= uVar3 + 8) {
        lj_state_growstack1((lua_State *)0x111d56);
      }
    }
  }
  else {
    iVar4 = in_ESI + -1;
    do {
      pTVar5 = lj_meta_cat(in_stack_ffffffffffffffa0,(TValue *)in_stack_ffffffffffffff98,
                           (int)((ulong)in_stack_ffffffffffffff90 >> 0x20));
      if (pTVar5 == (TValue *)0x0) {
        in_RDI[3].u64 = in_RDI[3].u64 + (long)iVar4 * -8;
        return;
      }
      iVar4 = iVar4 - (int)((long)(in_RDI[3].u64 - (long)pTVar5) >> 3);
      in_RDI[3].u64 = (uint64_t)(pTVar5 + 2);
      jit_secure_call((lua_State *)in_stack_ffffffffffffff68,in_RDI,iVar4);
      in_RDI[3].u64 = in_RDI[3].u64 - 8;
      in_stack_ffffffffffffffa0 = (lua_State *)(in_RDI[3].u64 - 8);
      in_stack_ffffffffffffff68 = in_RDI[3];
      uVar1 = *(undefined8 *)in_stack_ffffffffffffff68;
      in_stack_ffffffffffffffa0->nextgc = (GCRef)(int)uVar1;
      in_stack_ffffffffffffffa0->marked = (char)((ulong)uVar1 >> 0x20);
      in_stack_ffffffffffffffa0->gct = (char)((ulong)uVar1 >> 0x28);
      in_stack_ffffffffffffffa0->dummy_ffid = (char)((ulong)uVar1 >> 0x30);
      in_stack_ffffffffffffffa0->status = (char)((ulong)uVar1 >> 0x38);
      in_stack_ffffffffffffff98 = "copy of dead GC object";
      iVar4 = iVar4 + -1;
    } while (0 < iVar4);
  }
  return;
}

Assistant:

LUA_API void lua_concat(lua_State *L, int n)
{
  lj_checkapi_slot(n);
  if (n >= 2) {
    n--;
    do {
      TValue *top = lj_meta_cat(L, L->top-1, -n);
      if (top == NULL) {
	L->top -= n;
	break;
      }
      n -= (int)(L->top - (top - 2*LJ_FR2));
      L->top = top+2;
      jit_secure_call(L, top, 1+1);
      L->top -= 1+LJ_FR2;
      copyTV(L, L->top-1, L->top+LJ_FR2);
    } while (--n > 0);
  } else if (n == 0) {  /* Push empty string. */
    setstrV(L, L->top, &G(L)->strempty);
    incr_top(L);
  }
  /* else n == 1: nothing to do. */
}